

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Vec_Str_t * Pdr_ManDumpString(Pdr_Man_t *p)

{
  long lVar1;
  Vec_Int_t *vStr_00;
  int iVar2;
  Pdr_Set_t *p_00;
  Vec_Ptr_t *local_40;
  int local_34;
  int kStart;
  int i;
  Pdr_Set_t *pCube;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *vFlopCounts;
  Vec_Str_t *vStr;
  Pdr_Man_t *p_local;
  
  vStr = (Vec_Str_t *)p;
  vFlopCounts = (Vec_Int_t *)Vec_StrAlloc(1000);
  iVar2 = Pdr_ManFindInvariantStart((Pdr_Man_t *)vStr);
  lVar1._0_4_ = vStr[0x12].nCap;
  lVar1._4_4_ = vStr[0x12].nSize;
  if (lVar1 == 0) {
    pCube = (Pdr_Set_t *)Pdr_ManCollectCubes((Pdr_Man_t *)vStr,iVar2);
  }
  else {
    pCube = (Pdr_Set_t *)Vec_PtrDup(*(Vec_Ptr_t **)(vStr + 0x12));
  }
  Vec_PtrSort((Vec_Ptr_t *)pCube,Pdr_SetCompare);
  if (*(int *)(*(long *)vStr + 0x3c) == 0) {
    local_40 = (Vec_Ptr_t *)0x0;
  }
  else {
    local_40 = (Vec_Ptr_t *)Pdr_ManCountFlops((Pdr_Man_t *)vStr,(Vec_Ptr_t *)pCube);
  }
  vCubes = local_40;
  for (local_34 = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)pCube), local_34 < iVar2;
      local_34 = local_34 + 1) {
    p_00 = (Pdr_Set_t *)Vec_PtrEntry((Vec_Ptr_t *)pCube,local_34);
    vStr_00 = vFlopCounts;
    if (p_00->nRefs != -1) {
      iVar2 = Aig_ManRegNum((Aig_Man_t *)vStr->pArray);
      Pdr_SetPrintStr((Vec_Str_t *)vStr_00,p_00,iVar2,(Vec_Int_t *)vCubes);
    }
  }
  Vec_IntFreeP((Vec_Int_t **)&vCubes);
  Vec_PtrFree((Vec_Ptr_t *)pCube);
  Vec_StrPush((Vec_Str_t *)vFlopCounts,'\0');
  return (Vec_Str_t *)vFlopCounts;
}

Assistant:

Vec_Str_t * Pdr_ManDumpString( Pdr_Man_t * p )
{
    Vec_Str_t * vStr;
    Vec_Int_t * vFlopCounts;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart;
    vStr = Vec_StrAlloc( 1000 );
    // collect cubes
    kStart = Pdr_ManFindInvariantStart( p );
    if ( p->vInfCubes == NULL )
        vCubes = Pdr_ManCollectCubes( p, kStart );
    else
        vCubes = Vec_PtrDup( p->vInfCubes );
    Vec_PtrSort( vCubes, (int (*)(void))Pdr_SetCompare );
    // collect variable appearances
    vFlopCounts = p->pPars->fUseSupp ? Pdr_ManCountFlops( p, vCubes ) : NULL; 
    // output cubes
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        Pdr_SetPrintStr( vStr, pCube, Aig_ManRegNum(p->pAig), vFlopCounts );  
    }
    Vec_IntFreeP( &vFlopCounts );
    Vec_PtrFree( vCubes );
    Vec_StrPush( vStr, '\0' );
    return vStr;
}